

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::ForwardEuler(ForwardEuler *this)

{
  element_type *peVar1;
  undefined8 *in_RDI;
  FixedStepIntegrator *in_stack_ffffffffffffff70;
  
  FixedStepIntegrator::FixedStepIntegrator(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__ForwardEuler_003fb5f0;
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0xb));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0xf));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x14));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x19));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x1e));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x23));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x28));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x2d));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x32));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x37));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x3c));
  *(undefined1 *)(in_RDI + 0x40) = 0;
  *(undefined1 *)((long)in_RDI + 0x201) = 0;
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::vector((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
            *)0x3a73bf);
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::vector((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
            *)0x3a73d8);
  *(undefined1 *)(in_RDI + 0x47) = 0;
  *(undefined1 *)((long)in_RDI + 0x239) = 0;
  *(undefined1 *)((long)in_RDI + 0x23a) = 0;
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
         *)0x3a7406);
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
         *)0x3a741f);
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
         *)0x3a7438);
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a7449);
  std::__cxx11::string::operator=((string *)peVar1,"ForwardEuler");
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a746b);
  peVar1->isExplicit = true;
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a7480);
  peVar1->numberOfStages = 1;
  return;
}

Assistant:

ForwardEuler::ForwardEuler()
            {
                m_infoData->name = "ForwardEuler";
                m_infoData->isExplicit = true;
                m_infoData->numberOfStages = 1;
            }